

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O2

astcenc_error astcenc_compress_reset(astcenc_context *ctxo)

{
  astcenc_contexti *ctx;
  
  if (((ctxo->context).config.flags & 0x10) == 0) {
    ParallelManager::reset(&ctxo->manage_avg);
    ParallelManager::reset(&ctxo->manage_compress);
    return ASTCENC_SUCCESS;
  }
  return ASTCENC_ERR_BAD_CONTEXT;
}

Assistant:

astcenc_error astcenc_compress_reset(
	astcenc_context* ctxo
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;
	if (ctx->config.flags & ASTCENC_FLG_DECOMPRESS_ONLY)
	{
		return ASTCENC_ERR_BAD_CONTEXT;
	}

	ctxo->manage_avg.reset();
	ctxo->manage_compress.reset();
	return ASTCENC_SUCCESS;
#endif
}